

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEncName(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar6 = 10000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar6 = 50000;
  }
  bVar1 = *ctxt->input->cur;
  if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
    xmlFatalErr(ctxt,XML_ERR_ENCODING_NAME,(char *)0x0);
    return (xmlChar *)0x0;
  }
  pbVar4 = (byte *)(*xmlMalloc)(10);
  if (pbVar4 == (byte *)0x0) {
    xmlCtxtErrMemory(ctxt);
    return (xmlChar *)0x0;
  }
  *pbVar4 = bVar1;
  iVar7 = 10;
  uVar8 = 1;
  do {
    xmlNextChar(ctxt);
    bVar1 = *ctxt->input->cur;
    if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
       ((0x32 < bVar1 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0)))) {
      pbVar4[uVar8 & 0xffffffff] = 0;
      return pbVar4;
    }
    pbVar5 = pbVar4;
    if (iVar7 <= (int)uVar8 + 1) {
      if (iVar7 < 1) {
        iVar7 = 1;
      }
      else {
        if (iVar6 <= iVar7) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"EncName");
          goto LAB_0013d875;
        }
        uVar3 = iVar7 + 1U >> 1;
        bVar2 = (int)(iVar6 - uVar3) < iVar7;
        iVar7 = uVar3 + iVar7;
        if (bVar2) {
          iVar7 = iVar6;
        }
      }
      pbVar5 = (byte *)(*xmlRealloc)(pbVar4,(size_t)iVar7);
      if (pbVar5 == (byte *)0x0) {
        xmlCtxtErrMemory(ctxt);
LAB_0013d875:
        (*xmlFree)(pbVar4);
        return (xmlChar *)0x0;
      }
    }
    pbVar5[uVar8] = bVar1;
    uVar8 = uVar8 + 1;
    pbVar4 = pbVar5;
  } while( true );
}

Assistant:

xmlChar *
xmlParseEncName(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;
    xmlChar cur;

    cur = CUR;
    if (((cur >= 'a') && (cur <= 'z')) ||
        ((cur >= 'A') && (cur <= 'Z'))) {
	buf = xmlMalloc(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}

	buf[len++] = cur;
	NEXT;
	cur = CUR;
	while (((cur >= 'a') && (cur <= 'z')) ||
	       ((cur >= 'A') && (cur <= 'Z')) ||
	       ((cur >= '0') && (cur <= '9')) ||
	       (cur == '.') || (cur == '_') ||
	       (cur == '-')) {
	    if (len + 1 >= size) {
	        xmlChar *tmp;
                int newSize;

                newSize = xmlGrowCapacity(size, 1, 1, maxLength);
                if (newSize < 0) {
                    xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "EncName");
                    xmlFree(buf);
                    return(NULL);
                }
		tmp = xmlRealloc(buf, newSize);
		if (tmp == NULL) {
		    xmlErrMemory(ctxt);
		    xmlFree(buf);
		    return(NULL);
		}
		buf = tmp;
                size = newSize;
	    }
	    buf[len++] = cur;
	    NEXT;
	    cur = CUR;
        }
	buf[len] = 0;
    } else {
	xmlFatalErr(ctxt, XML_ERR_ENCODING_NAME, NULL);
    }
    return(buf);
}